

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64func.cpp
# Opt level: O1

Error asmjit::v1_14::a64::FuncInternal::initFuncDetail(FuncDetail *func,FuncSignature *signature)

{
  TypeId TVar1;
  bool bVar2;
  RegType RVar3;
  uint uVar4;
  int iVar5;
  Error EVar6;
  FuncValue *pFVar7;
  RegOrder *pRVar8;
  uint32_t uVar9;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  FuncDetail *pFVar14;
  uint32_t valueIndex;
  size_t index;
  char cVar15;
  RegGroup local_56 [2];
  uint local_54;
  uint local_50;
  uint local_4c;
  FuncDetail *local_48;
  FuncDetail *local_40;
  ulong local_38;
  
  local_38 = (ulong)(byte)func[0x74];
  bVar10 = func[2] != (FuncDetail)0x3;
  local_48 = func;
  if (*(int *)(func + 0x8c) != 0) {
    local_54 = CONCAT31(local_54._1_3_,func[2] != (FuncDetail)0x3);
    pFVar14 = func + 0x8c;
    uVar12 = 0;
    index = 0;
    do {
      if (index == 4) {
        cVar15 = '\x02';
        break;
      }
      pFVar7 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
      uVar13 = pFVar7->_data;
      TVar1 = (TypeId)uVar13;
      uVar11 = (ulong)TVar1;
      if (TVar1 < _kFloatStart) {
        if ((0x5400000000U >> (uVar11 & 0x3f) & 1) == 0) {
          if ((0xa800000000U >> (uVar11 & 0x3f) & 1) == 0) {
            if ((0x30000000000U >> (uVar11 & 0x3f) & 1) == 0) goto LAB_00138059;
            pFVar7 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
            uVar9 = (uVar13 & 0xff) + uVar12 + 0x7000100;
          }
          else {
            pFVar7 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
            uVar9 = uVar12 | 0x6000127;
          }
        }
        else {
          pFVar7 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
          uVar9 = uVar12 | 0x6000126;
        }
        pFVar7->_data = uVar9;
        cVar15 = '\0';
        bVar2 = true;
      }
      else {
LAB_00138059:
        if ((uVar13 & 0xff) == 0) {
          bVar2 = false;
          cVar15 = '\x02';
        }
        else {
          RVar3 = regTypeFromFpOrVecTypeId(TVar1);
          cVar15 = RVar3 == kNone;
          if (!(bool)cVar15) {
            pFVar7 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
            pFVar7->_data = ((uint)RVar3 << 0x18 | uVar13 & 0xff) + uVar12 + 0x100;
          }
          bVar2 = !(bool)cVar15;
        }
      }
      index = index + 1;
      uVar12 = uVar12 + 0x10000;
    } while (bVar2);
    bVar10 = (byte)local_54;
    if (cVar15 != '\x02') {
      return 0x1b;
    }
  }
  if ((local_48[2] == (FuncDetail)0x3) || (local_48[2] == (FuncDetail)0x0)) {
    local_4c = (uint)bVar10 * 4 + 4;
    pFVar14 = local_48 + 0x9c;
    local_40 = local_48 + 0x34;
    local_50 = 0;
    local_54 = 0;
    uVar12 = 0;
    for (uVar11 = 0; local_38 != uVar11; uVar11 = uVar11 + 1) {
      uVar13 = *(uint *)pFVar14 & 0xff;
      TVar1 = (TypeId)*(uint *)pFVar14;
      if (uVar13 - 0x20 < 10) {
        uVar9 = 0xff;
        if (local_54 < 0x10) {
          local_56[1] = 0;
          pRVar8 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                   operator[]<asmjit::v1_14::RegGroup>
                             ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_40,local_56 + 1
                             );
          uVar9 = (uint32_t)pRVar8->id[local_54];
        }
        if (uVar9 == 0xff) {
LAB_001381d2:
          uVar4 = local_4c;
          if (local_4c <= (byte)TypeUtils::_typeData[(ulong)uVar13 + 0x100]) {
            uVar4 = (uint)(byte)TypeUtils::_typeData[(ulong)uVar13 + 0x100];
          }
          uVar13 = uVar12 + 7 & 0xfffffff8;
          if (uVar4 < 8) {
            uVar13 = uVar12;
          }
          FuncValue::assignStackOffset((FuncValue *)pFVar14,uVar13);
          uVar12 = uVar13 + uVar4;
          iVar5 = 9;
        }
        else {
          FuncValue::assignRegData((FuncValue *)pFVar14,kARM_GpX - (TVar1 < kInt64),uVar9);
          *(uint *)(local_48 + 0x78) = *(uint *)(local_48 + 0x78) | 1 << ((byte)uVar9 & 0x1f);
          local_54 = local_54 + 1;
LAB_0013823f:
          iVar5 = 9;
        }
      }
      else {
        iVar5 = 0;
        if (uVar13 - 0x33 < 0x32 || uVar13 - 0x2a < 3) {
          uVar9 = 0xff;
          if (local_50 < 0x10) {
            local_56[0] = kVec;
            pRVar8 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                     operator[]<asmjit::v1_14::RegGroup>
                               ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_40,local_56);
            uVar9 = (uint32_t)pRVar8->id[local_50];
          }
          if (uVar9 == 0xff) goto LAB_001381d2;
          RVar3 = regTypeFromFpOrVecTypeId(TVar1);
          if (RVar3 != kNone) {
            *(uint *)pFVar14 = uVar13;
            FuncValue::assignRegData((FuncValue *)pFVar14,RVar3,uVar9);
            *(uint *)(local_48 + 0x7c) = *(uint *)(local_48 + 0x7c) | 1 << ((byte)uVar9 & 0x1f);
            local_50 = local_50 + 1;
            goto LAB_0013823f;
          }
          iVar5 = 1;
        }
      }
      if ((iVar5 != 9) && (iVar5 != 0)) break;
      pFVar14 = pFVar14 + 0x10;
    }
    EVar6 = 0x1b;
    if (local_38 <= uVar11) {
      *(uint *)(local_48 + 0x88) = uVar12 + 7 & 0xfffffff8;
      EVar6 = 0;
    }
  }
  else {
    EVar6 = 3;
  }
  return EVar6;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initFuncDetail(FuncDetail& func, const FuncSignature& signature) noexcept {
  DebugUtils::unused(signature);

  const CallConv& cc = func.callConv();
  uint32_t stackOffset = 0;

  uint32_t i;
  uint32_t argCount = func.argCount();

  // Minimum stack size of a single argument passed via stack. The standard AArch64 calling convention
  // specifies 8 bytes, so each function argument would occupy at least 8 bytes even if it needs less.
  // However, Apple has decided to not follow this rule and function argument can occupy less, for
  // example two consecutive 32-bit arguments would occupy 8 bytes total, instead of 16 as specified
  // by ARM.
  uint32_t minStackArgSize = cc.strategy() == CallConvStrategy::kAArch64Apple ? 4u : 8u;

  if (func.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      TypeId typeId = func._rets[valueIndex].typeId();

      // Terminate at the first void type (end of the pack).
      if (typeId == TypeId::kVoid)
        break;

      switch (typeId) {
        case TypeId::kInt8:
        case TypeId::kInt16:
        case TypeId::kInt32: {
          func._rets[valueIndex].initReg(RegType::kARM_GpW, valueIndex, TypeId::kInt32);
          break;
        }

        case TypeId::kUInt8:
        case TypeId::kUInt16:
        case TypeId::kUInt32: {
          func._rets[valueIndex].initReg(RegType::kARM_GpW, valueIndex, TypeId::kUInt32);
          break;
        }

        case TypeId::kInt64:
        case TypeId::kUInt64: {
          func._rets[valueIndex].initReg(RegType::kARM_GpX, valueIndex, typeId);
          break;
        }

        default: {
          RegType regType = regTypeFromFpOrVecTypeId(typeId);
          if (regType == RegType::kNone)
            return DebugUtils::errored(kErrorInvalidRegType);

          func._rets[valueIndex].initReg(regType, valueIndex, typeId);
          break;
        }
      }
    }
  }

  switch (cc.strategy()) {
    case CallConvStrategy::kDefault:
    case CallConvStrategy::kAArch64Apple: {
      uint32_t gpzPos = 0;
      uint32_t vecPos = 0;

      for (i = 0; i < argCount; i++) {
        FuncValue& arg = func._args[i][0];
        TypeId typeId = arg.typeId();

        if (TypeUtils::isInt(typeId)) {
          uint32_t regId = BaseReg::kIdBad;

          if (gpzPos < CallConv::kMaxRegArgsPerGroup)
            regId = cc._passedOrder[RegGroup::kGp].id[gpzPos];

          if (regId != BaseReg::kIdBad) {
            RegType regType = typeId <= TypeId::kUInt32 ? RegType::kARM_GpW : RegType::kARM_GpX;
            arg.assignRegData(regType, regId);
            func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
            gpzPos++;
          }
          else {
            uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), minStackArgSize);
            if (size >= 8)
              stackOffset = Support::alignUp(stackOffset, 8);
            arg.assignStackOffset(int32_t(stackOffset));
            stackOffset += size;
          }
          continue;
        }

        if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
          uint32_t regId = BaseReg::kIdBad;

          if (vecPos < CallConv::kMaxRegArgsPerGroup)
            regId = cc._passedOrder[RegGroup::kVec].id[vecPos];

          if (regId != BaseReg::kIdBad) {
            RegType regType = regTypeFromFpOrVecTypeId(typeId);
            if (regType == RegType::kNone)
              return DebugUtils::errored(kErrorInvalidRegType);

            arg.initTypeId(typeId);
            arg.assignRegData(regType, regId);
            func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
            vecPos++;
          }
          else {
            uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), minStackArgSize);
            if (size >= 8)
              stackOffset = Support::alignUp(stackOffset, 8);
            arg.assignStackOffset(int32_t(stackOffset));
            stackOffset += size;
          }
          continue;
        }
      }
      break;
    }

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  func._argStackSize = Support::alignUp(stackOffset, 8u);
  return kErrorOk;
}